

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFReadBufferSetup(TIFF *tif,void *bp,tmsize_t size)

{
  uint8_t *puVar1;
  bool bVar2;
  tmsize_t size_local;
  void *bp_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20000) != 0) {
    __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                  ,0x545,"int TIFFReadBufferSetup(TIFF *, void *, tmsize_t)");
  }
  tif->tif_flags = tif->tif_flags & 0xff7fffff;
  if (tif->tif_rawdata != (uint8_t *)0x0) {
    if ((tif->tif_flags & 0x200) != 0) {
      _TIFFfreeExt(tif,tif->tif_rawdata);
    }
    tif->tif_rawdata = (uint8_t *)0x0;
    tif->tif_rawdatasize = 0;
  }
  if (bp == (void *)0x0) {
    tif->tif_rawdatasize = size + 0x3ffU & 0xfffffffffffffc00;
    if (tif->tif_rawdatasize == 0) {
      TIFFErrorExtR(tif,"TIFFReadBufferSetup","Invalid buffer size");
      return 0;
    }
    puVar1 = (uint8_t *)_TIFFcallocExt(tif,1,tif->tif_rawdatasize);
    tif->tif_rawdata = puVar1;
    tif->tif_flags = tif->tif_flags | 0x200;
  }
  else {
    tif->tif_rawdatasize = size;
    tif->tif_rawdata = (uint8_t *)bp;
    tif->tif_flags = tif->tif_flags & 0xfffffdff;
  }
  bVar2 = tif->tif_rawdata != (uint8_t *)0x0;
  if (!bVar2) {
    TIFFErrorExtR(tif,"TIFFReadBufferSetup","No space for data buffer at scanline %u",
                  (ulong)tif->tif_row);
    tif->tif_rawdatasize = 0;
  }
  tif_local._4_4_ = (uint)bVar2;
  return tif_local._4_4_;
}

Assistant:

int TIFFReadBufferSetup(TIFF *tif, void *bp, tmsize_t size)
{
    static const char module[] = "TIFFReadBufferSetup";

    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    tif->tif_flags &= ~TIFF_BUFFERMMAP;

    if (tif->tif_rawdata)
    {
        if (tif->tif_flags & TIFF_MYBUFFER)
            _TIFFfreeExt(tif, tif->tif_rawdata);
        tif->tif_rawdata = NULL;
        tif->tif_rawdatasize = 0;
    }
    if (bp)
    {
        tif->tif_rawdatasize = size;
        tif->tif_rawdata = (uint8_t *)bp;
        tif->tif_flags &= ~TIFF_MYBUFFER;
    }
    else
    {
        tif->tif_rawdatasize = (tmsize_t)TIFFroundup_64((uint64_t)size, 1024);
        if (tif->tif_rawdatasize == 0)
        {
            TIFFErrorExtR(tif, module, "Invalid buffer size");
            return (0);
        }
        /* Initialize to zero to avoid uninitialized buffers in case of */
        /* short reads (http://bugzilla.maptools.org/show_bug.cgi?id=2651) */
        tif->tif_rawdata =
            (uint8_t *)_TIFFcallocExt(tif, 1, tif->tif_rawdatasize);
        tif->tif_flags |= TIFF_MYBUFFER;
    }
    if (tif->tif_rawdata == NULL)
    {
        TIFFErrorExtR(tif, module,
                      "No space for data buffer at scanline %" PRIu32,
                      tif->tif_row);
        tif->tif_rawdatasize = 0;
        return (0);
    }
    return (1);
}